

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O2

string * __thiscall
t_xml_generator::escape_xml_string
          (string *__return_storage_ptr__,t_xml_generator *this,string *input)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  char *pcVar4;
  size_type sVar5;
  ostringstream ss;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar2 = (input->_M_dataplus)._M_p;
  sVar3 = input->_M_string_length;
  sVar5 = 0;
  do {
    if (sVar3 == sVar5) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      return __return_storage_ptr__;
    }
    cVar1 = pcVar2[sVar5];
    pcVar4 = "&quot;";
    if (cVar1 == '\"') {
LAB_002bcae0:
      std::operator<<((ostream *)local_1a8,pcVar4);
    }
    else {
      if (cVar1 == '>') {
        pcVar4 = "&gt;";
        goto LAB_002bcae0;
      }
      if (cVar1 == '\'') {
        pcVar4 = "&apos;";
        goto LAB_002bcae0;
      }
      if (cVar1 == '<') {
        pcVar4 = "&lt;";
        goto LAB_002bcae0;
      }
      if (cVar1 == '&') {
        pcVar4 = "&amp;";
        goto LAB_002bcae0;
      }
      std::operator<<((ostream *)local_1a8,cVar1);
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

string t_xml_generator::escape_xml_string(const string& input) {
  std::ostringstream ss;
  for (char iter : input) {
    switch (iter) {
    case '&':
      ss << "&amp;";
      break;
    case '"':
      ss << "&quot;";
      break;
    case '\'':
      ss << "&apos;";
      break;
    case '<':
      ss << "&lt;";
      break;
    case '>':
      ss << "&gt;";
      break;
    default:
      ss << iter;
      break;
    }
  }
  return ss.str();
}